

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_pivotref.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan(Binder *this,BoundPivotRef *ref)

{
  element_type *peVar1;
  Binder *ref_00;
  long in_RDX;
  templated_unique_single_t result;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> subquery;
  element_type *local_30;
  element_type *local_28;
  
  ref_00 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)(in_RDX + 0x20));
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
            ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> *)
             (in_RDX + 0x30));
  CreatePlan((Binder *)&stack0xffffffffffffffd8,(BoundTableRef *)ref_00);
  make_uniq<duckdb::LogicalPivot,unsigned_long&,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,duckdb::BoundPivotInfo>
            ((duckdb *)&local_30,(unsigned_long *)(in_RDX + 0x18),
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&stack0xffffffffffffffd8,(BoundPivotInfo *)(in_RDX + 0x38));
  peVar1 = local_30;
  local_30 = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  if (local_28 != (element_type *)0x0) {
    (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(((local_28->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                        internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ + 8))->_M_pi)
              ();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundPivotRef &ref) {
	auto subquery = ref.child_binder->CreatePlan(*ref.child);

	auto result = make_uniq<LogicalPivot>(ref.bind_index, std::move(subquery), std::move(ref.bound_pivot));
	return std::move(result);
}